

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O1

void __thiscall
google::protobuf::util::
StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::StatusOr
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Status *status)

{
  StringPiece error_message;
  Status local_48;
  
  Status::Status(&this->status_);
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  if (status->error_code_ == OK) {
    error_message.length_ = 0x23;
    error_message.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_48,INTERNAL,error_message);
    Status::operator=(&this->status_,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.error_message_._M_dataplus._M_p != &local_48.error_message_.field_2) {
      operator_delete(local_48.error_message_._M_dataplus._M_p);
    }
  }
  else {
    Status::operator=(&this->status_,status);
  }
  return;
}

Assistant:

inline StatusOr<T>::StatusOr(const Status& status) {
  if (status.ok()) {
    status_ = Status(error::INTERNAL, "Status::OK is not a valid argument.");
  } else {
    status_ = status;
  }
}